

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

bool __thiscall QMap<int,_QString>::contains(QMap<int,_QString> *this,int *key)

{
  int iVar1;
  QMapData<std::map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>
  *pQVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == (QMapData<std::map<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>
                 *)0x0) {
    return false;
  }
  p_Var4 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  p_Var3 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = &p_Var3->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    iVar1 = *key;
    p_Var5 = &p_Var3->_M_header;
    do {
      if (iVar1 <= (int)p_Var4[1]._M_color) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar1];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var3) && (p_Var6 = p_Var5, iVar1 < (int)p_Var5[1]._M_color))
    {
      p_Var6 = &p_Var3->_M_header;
    }
  }
  return (_Rb_tree_header *)p_Var6 != p_Var3;
}

Assistant:

constexpr P get() const noexcept { return ptr; }